

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyevent.c
# Opt level: O1

void taking_mouse_down(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  sbyte sVar6;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint *puVar15;
  uint uVar16;
  uint uVar17;
  uint *puVar18;
  int iVar19;
  uint uVar20;
  uint *local_60;
  int local_54;
  uint *local_50;
  byte bVar7;
  
  uVar4 = displaywidth;
  iVar3 = LastCursorClippingX;
  if (DisplayInitialized != 0) {
    uVar5 = displaywidth + 0xf;
    if (-1 < (int)displaywidth) {
      uVar5 = displaywidth;
    }
    if (LastCursorX < 0) {
      uVar9 = -(ulong)(7U - LastCursorX >> 3);
    }
    else {
      uVar9 = (ulong)((uint)LastCursorX >> 3);
    }
    uVar9 = (long)DisplayRegion68k + uVar9 + (long)((int)uVar5 >> 4) * (long)LastCursorY * 2;
    if (0 < LastCursorClippingY) {
      uVar5 = (LastCursorX & 7U) + ((uint)uVar9 & 3) * 8;
      uVar8 = -uVar5 & 0x1f;
      uVar11 = 0;
      uVar12 = -(uint)(uVar8 == 0) | ~(-1 << (sbyte)uVar8);
      uVar10 = (LastCursorClippingX + uVar5) - 1 & 0x1f;
      uVar13 = -1 << (~(byte)uVar10 & 0x1f);
      uVar14 = -(uint)(uVar5 == 0) | -1 << (-(char)uVar5 & 0x1fU) ^ 0xffffffffU;
      uVar17 = uVar13 & uVar14;
      local_50 = (uint *)(uVar9 & 0xfffffffffffffffc);
      local_60 = (uint *)MonoCursor_savebitmap;
      local_54 = LastCursorClippingX;
      uVar20 = 0;
      iVar2 = LastCursorClippingY;
      uVar16 = uVar5;
      do {
        sVar6 = (sbyte)uVar8;
        bVar7 = (byte)uVar5;
        if (uVar16 < uVar20) {
          if (0x20 < (int)(iVar3 + uVar20)) {
            uVar5 = local_60[1];
            puVar18 = local_60 + 2;
            uVar8 = uVar5 >> (bVar7 & 0x1f) & uVar12 | *local_60 << sVar6;
            goto LAB_0012936c;
          }
          if (uVar20 <= uVar16) goto LAB_00129352;
          puVar18 = local_60 + 1;
          uVar8 = *local_60 << sVar6;
        }
        else {
LAB_00129352:
          puVar18 = local_60 + 1;
          uVar5 = *local_60;
          uVar8 = uVar5 >> (bVar7 & 0x1f) & uVar12;
LAB_0012936c:
          uVar11 = ~uVar12 & uVar5 << sVar6;
        }
        puVar15 = local_50;
        if ((int)(iVar3 + uVar16) < 0x21) {
LAB_0012938c:
          *puVar15 = (uVar8 ^ *puVar15) & uVar17 ^ *puVar15;
        }
        else {
          iVar19 = (int)(uVar16 + iVar3) >> 5;
          *local_50 = (uVar8 ^ *local_50) & uVar14 ^ *local_50;
          puVar15 = local_50 + 1;
          if (uVar20 == uVar16) {
            for (; 1 < iVar19; iVar19 = iVar19 + -1) {
              uVar5 = *puVar18;
              puVar18 = puVar18 + 1;
              *puVar15 = uVar5;
              puVar15 = puVar15 + 1;
            }
          }
          else {
            for (; 1 < iVar19; iVar19 = iVar19 + -1) {
              uVar5 = *puVar18;
              puVar18 = puVar18 + 1;
              uVar17 = uVar5 >> (bVar7 & 0x1f) | uVar11;
              uVar11 = uVar5 << sVar6;
              *puVar15 = uVar17;
              puVar15 = puVar15 + 1;
            }
          }
          if (uVar10 != 0x1f) {
            uVar17 = uVar13;
            uVar8 = uVar11;
            if ((local_54 - 1U & 0x1f) <= uVar10) {
              uVar8 = *puVar18 >> (bVar7 & 0x1f) & uVar12 | uVar11;
            }
            goto LAB_0012938c;
          }
        }
        uVar12 = uVar16 + uVar4;
        local_50 = local_50 + ((int)uVar12 >> 5);
        uVar16 = uVar12 & 0x1f;
        uVar10 = (uVar16 + iVar3) - 1 & 0x1f;
        uVar14 = -(uint)(uVar16 == 0) | ~(-1 << (-(char)uVar16 & 0x1fU));
        uVar13 = -1 << (~(byte)uVar10 & 0x1f);
        uVar17 = uVar13 & uVar14;
        uVar8 = uVar20 + 0x10;
        local_60 = local_60 + (uVar8 >> 5);
        local_54 = uVar20 + iVar3 + 0x10;
        uVar20 = uVar8 & 0x1f;
        uVar5 = uVar12 - uVar8 & 0x1f;
        uVar8 = uVar8 - uVar12 & 0x1f;
        uVar12 = -(uint)(uVar8 == 0) | ~(-1 << (sbyte)uVar8);
        bVar1 = 1 < iVar2;
        iVar2 = iVar2 + -1;
      } while (bVar1);
    }
  }
  return;
}

Assistant:

void taking_mouse_down(void) {
  DLword *srcbase, *dstbase;
  static int sx, dx, w, h, srcbpl, dstbpl, backwardflg = 0;
  static int src_comp = 0, op = 0, gray = 0, num_gray = 0, curr_gray_line = 0;

#ifdef DOS
  (currentdsp->mouse_invisible)(currentdsp, IOPage);
#else
  if (!DisplayInitialized) return;

  /* restore saved image */
  srcbase = MonoCursor_savebitmap;
  dstbase = DisplayRegion68k + ((LastCursorY)*DLWORD_PERLINE); /* old y */
  sx = 0;
  dx = LastCursorX;        /* old x */
  w = LastCursorClippingX; /* Old clipping */
  h = LastCursorClippingY;
  srcbpl = HARD_CURSORWIDTH;
  dstbpl = displaywidth;
  op = 0;
  new_bitblt_code;
#ifdef DISPLAYBUFFER
  flush_display_region(dx, (LastCursorY), w, h);
#endif /* DISPLAYBUFFER */
#endif /* DOS */
}